

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_node(REF_NODE ref_node,REF_BOOL swap_endian,REF_INT version,REF_BOOL twod,FILE *file)

{
  long lVar1;
  undefined8 *puVar2;
  REF_DBL *pRVar3;
  REF_BOOL RVar4;
  FILE *__s;
  uint uVar5;
  REF_STATUS RVar6;
  void *__ptr;
  void *__ptr_00;
  long lVar7;
  size_t sVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  REF_STATUS ref_private_macro_code_rxs;
  REF_MPI ref_mpi;
  long lVar13;
  long lVar14;
  long lVar15;
  REF_DBL RVar16;
  undefined8 uVar17;
  double dVar18;
  REF_BOOL node_not_used_once;
  ulong local_b0;
  REF_BOOL local_a4;
  REF_NODE local_a0;
  ulong local_98;
  ulong local_90;
  void *local_88;
  long local_80;
  REF_MPI local_78;
  ulong local_70;
  uint local_68;
  REF_BOOL local_64;
  uint local_60;
  REF_INT local;
  ulong local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  FILE *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  node_not_used_once = 0;
  uVar5 = (int)(ref_node->old_n_global / (long)ref_mpi->n) + 1;
  uVar10 = 0x7fffffff;
  if (0 < ref_mpi->reduce_byte_limit) {
    uVar10 = (ulong)((uint)ref_mpi->reduce_byte_limit >> 5);
  }
  local_a0 = ref_node;
  if (((int)uVar5 < (int)uVar10) && (uVar10 = (ulong)uVar5, (int)uVar5 < 0)) {
    pcVar12 = "malloc local_xyzm of REF_DBL negative";
    uVar17 = 0x4ba;
LAB_0012d6b5:
    RVar6 = 1;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar17
           ,"ref_gather_node",pcVar12);
  }
  else {
    local_98 = (ulong)(uint)((int)uVar10 * 4);
    sVar8 = local_98 * 8;
    local_b0 = ref_node->old_n_global;
    local_64 = twod;
    local_58 = uVar10;
    __ptr = malloc(sVar8);
    if (__ptr == (void *)0x0) {
      pcVar12 = "malloc local_xyzm of REF_DBL NULL";
      uVar17 = 0x4ba;
    }
    else {
      __ptr_00 = malloc(sVar8);
      if (__ptr_00 != (void *)0x0) {
        local_50 = local_58 & 0xffffffff;
        local_68 = version - 1;
        iVar9 = (int)local_98;
        local_98 = local_98 & 0xffffffff;
        if (iVar9 < 1) {
          local_98 = 0;
        }
        lVar15 = 0;
        uVar10 = local_b0;
        local_a4 = swap_endian;
        local_88 = __ptr_00;
        local_78 = ref_mpi;
        local_40 = (ulong)(uint)version;
        local_38 = (FILE *)file;
        while (uVar11 = uVar10 - lVar15, uVar11 != 0 && lVar15 <= (long)uVar10) {
          if ((long)local_50 < (long)uVar11) {
            uVar11 = local_58;
          }
          local_b0 = uVar11 & 0xffffffff;
          for (uVar10 = 0; local_98 != uVar10; uVar10 = uVar10 + 1) {
            *(undefined8 *)((long)__ptr + uVar10 * 8) = 0;
          }
          local_48 = lVar15 + (int)uVar11;
          local_90 = local_b0;
          if ((int)uVar11 < 1) {
            local_90 = 0;
          }
          lVar1 = local_90 * 4;
          lVar13 = 0;
          local_80 = lVar15;
          for (lVar14 = 0; ref_mpi = local_78, __ptr_00 = local_88, lVar1 - lVar14 != 0;
              lVar14 = lVar14 + 4) {
            uVar5 = ref_node_local(local_a0,lVar15,&local);
            if ((uVar5 != 0) && (uVar5 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x4ca,"ref_gather_node",(ulong)uVar5,"node local failed");
              local_60 = uVar5;
            }
            if (uVar5 == 5) {
LAB_0012d444:
              lVar7 = lVar13 * 4;
              puVar2 = (undefined8 *)((long)__ptr + lVar14 * 8);
              *puVar2 = 0;
              puVar2[1] = 0;
              RVar16 = 0.0;
              uVar17 = 0;
            }
            else {
              if (uVar5 != 0) {
                return local_60;
              }
              lVar7 = (long)local;
              if (local_78->id != local_a0->part[lVar7]) goto LAB_0012d444;
              pRVar3 = local_a0->real;
              *(REF_DBL *)((long)__ptr + lVar14 * 8) = pRVar3[lVar7 * 0xf];
              *(REF_DBL *)((long)__ptr + lVar14 * 8 + 8) = pRVar3[lVar7 * 0xf + 1];
              RVar16 = pRVar3[lVar7 * 0xf + 2];
              uVar17 = 0x3ff0000000000000;
              lVar7 = lVar14;
            }
            *(REF_DBL *)((long)__ptr + lVar7 * 8 + 0x10) = RVar16;
            *(undefined8 *)((long)__ptr + lVar7 * 8 + 0x18) = uVar17;
            lVar13 = lVar13 + 1;
            lVar15 = lVar15 + 1;
          }
          uVar5 = ref_mpi_sum(local_78,__ptr,local_88,(int)local_b0 << 2,3);
          if (uVar5 != 0) {
            pcVar12 = "sum";
            uVar17 = 0x4d9;
            goto LAB_0012d802;
          }
          if (ref_mpi->id == 0) {
            local_90 = local_90 << 5;
            lVar15 = local_80;
            for (uVar10 = 0; local_90 != uVar10; uVar10 = uVar10 + 0x20) {
              dVar18 = *(double *)((long)__ptr_00 + uVar10 + 0x18) + -1.0;
              if (dVar18 <= -dVar18) {
                dVar18 = -dVar18;
              }
              if (0.1 < dVar18) {
                printf("error gather node %ld %f\n",lVar15);
                node_not_used_once = 1;
              }
              __s = local_38;
              RVar4 = local_a4;
              uVar11 = *(ulong *)((long)__ptr_00 + uVar10);
              local_70 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                         (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                         (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
              if (local_a4 == 0) {
                local_70 = uVar11;
              }
              local_80 = lVar15;
              sVar8 = fwrite(&local_70,8,1,local_38);
              if (sVar8 != 1) {
                pcVar12 = "x";
                uVar17 = 0x4e4;
LAB_0012d7d1:
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar17,"ref_gather_node",pcVar12,1,sVar8);
                return 1;
              }
              uVar11 = *(ulong *)((long)local_88 + uVar10 + 8);
              local_70 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                         (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                         (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                         (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
              if (RVar4 == 0) {
                local_70 = uVar11;
              }
              local_b0 = uVar10;
              sVar8 = fwrite(&local_70,8,1,__s);
              __ptr_00 = local_88;
              uVar10 = local_b0;
              if (sVar8 != 1) {
                pcVar12 = "y";
                uVar17 = 0x4e7;
                goto LAB_0012d7d1;
              }
              if (local_64 == 0) {
                uVar11 = *(ulong *)((long)local_88 + local_b0 + 0x10);
                local_70 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                           (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                           (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                           (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
                if (local_a4 == 0) {
                  local_70 = uVar11;
                }
                sVar8 = fwrite(&local_70,8,1,__s);
                if (sVar8 != 1) {
                  pcVar12 = "z";
                  uVar17 = 0x4eb;
                  goto LAB_0012d7d1;
                }
              }
              if ((local_68 < 4) &&
                 (RVar6 = ref_gather_meshb_int((FILE *)__s,(REF_INT)local_40,1), RVar6 != 0)) {
                pcVar12 = "nnode";
                uVar5 = 1;
                uVar17 = 0x4ef;
                goto LAB_0012d802;
              }
              lVar15 = local_80 + 1;
              ref_mpi = local_78;
            }
          }
          lVar15 = local_48;
          uVar10 = local_a0->old_n_global;
        }
        free(__ptr_00);
        free(__ptr);
        uVar5 = ref_mpi_all_or(ref_mpi,&node_not_used_once);
        if (uVar5 != 0) {
          pcVar12 = "all gather error code";
          uVar17 = 0x4f6;
LAB_0012d802:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar17,"ref_gather_node",(ulong)uVar5,pcVar12);
          return uVar5;
        }
        if (node_not_used_once == 0) {
          return 0;
        }
        pcVar12 = "node used more or less than once";
        uVar17 = 0x4f7;
        goto LAB_0012d6b5;
      }
      pcVar12 = "malloc xyzm of REF_DBL NULL";
      uVar17 = 0x4bb;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar17
           ,"ref_gather_node",pcVar12);
    RVar6 = 2;
  }
  return RVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node(REF_NODE ref_node,
                                          REF_BOOL swap_endian, REF_INT version,
                                          REF_BOOL twod, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_DBL swapped_dbl;
  REF_GLOB nnode_written, first, global;
  REF_INT n, i;
  REF_INT local;
  REF_STATUS status;
  REF_BOOL node_not_used_once = REF_FALSE;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 4 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 4 * chunk, REF_DBL);
  ref_malloc(xyzm, 4 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 4 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        local_xyzm[0 + 4 * i] = ref_node_xyz(ref_node, 0, local);
        local_xyzm[1 + 4 * i] = ref_node_xyz(ref_node, 1, local);
        local_xyzm[2 + 4 * i] = ref_node_xyz(ref_node, 2, local);
        local_xyzm[3 + 4 * i] = 1.0;
      } else {
        local_xyzm[0 + 4 * i] = 0.0;
        local_xyzm[1 + 4 * i] = 0.0;
        local_xyzm[2 + 4 * i] = 0.0;
        local_xyzm[3 + 4 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 4 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[3 + 4 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[3 + 4 * i]);
          node_not_used_once = REF_TRUE;
        }
        swapped_dbl = xyzm[0 + 4 * i];
        if (swap_endian) SWAP_DBL(swapped_dbl);
        REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "x");
        swapped_dbl = xyzm[1 + 4 * i];
        if (swap_endian) SWAP_DBL(swapped_dbl);
        REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "y");
        if (!twod) {
          swapped_dbl = xyzm[2 + 4 * i];
          if (swap_endian) SWAP_DBL(swapped_dbl);
          REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "z");
        }
        if (1 <= version && version <= 4)
          RSS(ref_gather_meshb_int(file, version, REF_EXPORT_MESHB_VERTEX_ID),
              "nnode");
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  RSS(ref_mpi_all_or(ref_mpi, &node_not_used_once), "all gather error code");
  RAS(!node_not_used_once, "node used more or less than once");

  return REF_SUCCESS;
}